

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

void __thiscall
deqp::RobustBufferAccessBehavior::Program::Init
          (Program *this,string *compute_shader,string *fragment_shader,string *geometry_shader,
          string *tesselation_control_shader,string *tesselation_evaluation_shader,
          string *vertex_shader)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  string *tesselation_evaluation_shader_local;
  string *tesselation_control_shader_local;
  string *geometry_shader_local;
  string *fragment_shader_local;
  string *compute_shader_local;
  Program *this_local;
  Functions *gl_00;
  
  Release(this);
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  RobustBufferAccessBehavior::Shader::Init(&this->m_compute,0x91b9,compute_shader);
  RobustBufferAccessBehavior::Shader::Init(&this->m_fragment,0x8b30,fragment_shader);
  RobustBufferAccessBehavior::Shader::Init(&this->m_geometry,0x8dd9,geometry_shader);
  RobustBufferAccessBehavior::Shader::Init(&this->m_tess_ctrl,0x8e88,tesselation_control_shader);
  RobustBufferAccessBehavior::Shader::Init(&this->m_tess_eval,0x8e87,tesselation_evaluation_shader);
  RobustBufferAccessBehavior::Shader::Init(&this->m_vertex,0x8b31,vertex_shader);
  Create(gl_00,&this->m_id);
  Attach(gl_00,this->m_id,(this->m_compute).m_id);
  Attach(gl_00,this->m_id,(this->m_fragment).m_id);
  Attach(gl_00,this->m_id,(this->m_geometry).m_id);
  Attach(gl_00,this->m_id,(this->m_tess_ctrl).m_id);
  Attach(gl_00,this->m_id,(this->m_tess_eval).m_id);
  Attach(gl_00,this->m_id,(this->m_vertex).m_id);
  Link(gl_00,this->m_id);
  return;
}

Assistant:

void Program::Init(const std::string& compute_shader, const std::string& fragment_shader,
				   const std::string& geometry_shader, const std::string& tesselation_control_shader,
				   const std::string& tesselation_evaluation_shader, const std::string& vertex_shader)
{
	/* Delete previous program */
	Release();

	/* GL entry points */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize shaders */
	m_compute.Init(GL_COMPUTE_SHADER, compute_shader);
	m_fragment.Init(GL_FRAGMENT_SHADER, fragment_shader);
	m_geometry.Init(GL_GEOMETRY_SHADER, geometry_shader);
	m_tess_ctrl.Init(GL_TESS_CONTROL_SHADER, tesselation_control_shader);
	m_tess_eval.Init(GL_TESS_EVALUATION_SHADER, tesselation_evaluation_shader);
	m_vertex.Init(GL_VERTEX_SHADER, vertex_shader);

	/* Create program, set up transform feedback and attach shaders */
	Create(gl, m_id);
	Attach(gl, m_id, m_compute.m_id);
	Attach(gl, m_id, m_fragment.m_id);
	Attach(gl, m_id, m_geometry.m_id);
	Attach(gl, m_id, m_tess_ctrl.m_id);
	Attach(gl, m_id, m_tess_eval.m_id);
	Attach(gl, m_id, m_vertex.m_id);

	/* Link program */
	Link(gl, m_id);
}